

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lysp_stmt_parse(lysp_ctx *pctx,lysp_stmt *stmt,void **result,lysp_ext_instance **exts)

{
  char ***texts;
  lysp_stmt *plVar1;
  char cVar2;
  LY_ERR LVar3;
  int iVar4;
  LY_ERR LVar5;
  lysp_node_action_inout *inout_p;
  lysp_restr *restr;
  lysp_type *type;
  long *plVar6;
  void *pvVar7;
  size_t sVar8;
  char *pcVar9;
  lysp_ext_instance **pplVar10;
  char **ppcVar11;
  uint32_t uVar12;
  lysp_deviate **extraout_RDX;
  lysp_deviate **extraout_RDX_00;
  lysp_deviate **extraout_RDX_01;
  ly_ctx *plVar13;
  lysp_stmt **pplVar14;
  long lVar15;
  lysp_stmt *plVar16;
  ly_stmt lVar17;
  yang_arg yVar18;
  lysp_ext_instance **in_R8;
  char *pcVar19;
  lysp_ext_instance **in_R9;
  long *plVar20;
  ly_ctx *ctx;
  uint16_t flags;
  uint6 uStack_56;
  char **local_50;
  lysp_ext_instance **local_48;
  lysp_qname **local_40;
  char **local_38;
  
  lVar17 = stmt->kw;
  pplVar10 = (lysp_ext_instance **)(ulong)(lVar17 - LY_STMT_NOTIFICATION);
  switch(pplVar10) {
  case (lysp_ext_instance **)0x0:
    LVar3 = lysp_stmt_notif(pctx,stmt,(lysp_node *)0x0,(lysp_node_notif **)result);
    return LVar3;
  case (lysp_ext_instance **)0x1:
  case (lysp_ext_instance **)0x3:
    inout_p = (lysp_node_action_inout *)calloc(1,0x60);
    *result = inout_p;
    if (inout_p != (lysp_node_action_inout *)0x0) {
      LVar3 = lysp_stmt_inout(pctx,stmt,(lysp_node *)0x0,inout_p);
      return LVar3;
    }
    goto LAB_00162696;
  case (lysp_ext_instance **)0x2:
  case (lysp_ext_instance **)0x4:
  case (lysp_ext_instance **)0x5:
  case (lysp_ext_instance **)0x6:
switchD_00162242_caseD_2:
    if (pctx == (lysp_ctx *)0x0) {
      plVar13 = (ly_ctx *)0x0;
    }
    else {
      plVar13 = (ly_ctx *)
                **(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
    }
    ly_log(plVar13,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c",
           0xe0b);
    return LY_EINT;
  case (lysp_ext_instance **)0x7:
switchD_00162242_caseD_7:
    LVar3 = lysp_stmt_action(pctx,stmt,(lysp_node *)0x0,(lysp_node_action **)result);
    return LVar3;
  }
  if (lVar17 == LY_STMT_RPC) goto switchD_00162242_caseD_7;
  if ((lVar17 == LY_STMT_ANYDATA) || (lVar17 == LY_STMT_ANYXML)) {
    LVar3 = lysp_stmt_any(pctx,stmt,(lysp_node *)0x0,(lysp_node **)result);
    return LVar3;
  }
  if (lVar17 == LY_STMT_AUGMENT) {
    LVar3 = lysp_stmt_augment(pctx,stmt,(lysp_node *)0x0,(lysp_node_augment **)result);
    return LVar3;
  }
  if (lVar17 == LY_STMT_CASE) {
    LVar3 = lysp_stmt_case(pctx,stmt,(lysp_node *)0x0,(lysp_node **)result);
    return LVar3;
  }
  if (lVar17 == LY_STMT_CHOICE) {
    LVar3 = lysp_stmt_choice(pctx,stmt,(lysp_node *)0x0,(lysp_node **)result);
    return LVar3;
  }
  if (lVar17 == LY_STMT_CONTAINER) {
    LVar3 = lysp_stmt_container(pctx,stmt,(lysp_node *)0x0,(lysp_node **)result);
    return LVar3;
  }
  if (lVar17 == LY_STMT_GROUPING) {
    LVar3 = lysp_stmt_grouping(pctx,stmt,(lysp_node *)0x0,(lysp_node_grp **)result);
    return LVar3;
  }
  if (lVar17 == LY_STMT_LEAF) {
    LVar3 = lysp_stmt_leaf(pctx,stmt,(lysp_node *)0x0,(lysp_node **)result);
    return LVar3;
  }
  if (lVar17 == LY_STMT_LEAF_LIST) {
    LVar3 = lysp_stmt_leaflist(pctx,stmt,(lysp_node *)0x0,(lysp_node **)result);
    return LVar3;
  }
  if (lVar17 == LY_STMT_LIST) {
    LVar3 = lysp_stmt_list(pctx,stmt,(lysp_node *)0x0,(lysp_node **)result);
    return LVar3;
  }
  if (lVar17 == LY_STMT_USES) {
    LVar3 = lysp_stmt_uses(pctx,stmt,(lysp_node *)0x0,(lysp_node **)result);
    return LVar3;
  }
  if (lVar17 != LY_STMT_ARGUMENT) {
    if (lVar17 == LY_STMT_BASE) {
      LVar3 = lysp_stmt_text_fields(pctx,stmt,(char ***)result,Y_IDENTIF_ARG,in_R8);
      return LVar3;
    }
    if (lVar17 != LY_STMT_BELONGS_TO) {
      if (lVar17 == LY_STMT_BIT) {
LAB_001622b6:
        LVar3 = lysp_stmt_type_enum(pctx,stmt,(lysp_type_enum **)result);
        return LVar3;
      }
      if (lVar17 == LY_STMT_CONFIG) {
        if ((uint16_t *)*result != (uint16_t *)0x0) {
          LVar3 = lysp_stmt_config(pctx,stmt,(uint16_t *)*result,(lysp_ext_instance **)0x0);
          return LVar3;
        }
        __assert_fail("*result",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                      ,0xd84,
                      "LY_ERR lysp_stmt_parse(struct lysp_ctx *, const struct lysp_stmt *, void **, struct lysp_ext_instance **)"
                     );
      }
      if (lVar17 != LY_STMT_CONTACT) {
        if (lVar17 == LY_STMT_DEFAULT) {
LAB_0016227a:
          LVar3 = lysp_stmt_qnames(pctx,stmt,(lysp_qname **)result,Y_IDENTIF_ARG,in_R8);
          return LVar3;
        }
        if (lVar17 != LY_STMT_DESCRIPTION) {
          plVar16 = stmt;
          if (lVar17 == LY_STMT_DEVIATE) {
LAB_00163922:
            lysp_stmt_deviate(pctx,plVar16,(lysp_deviate **)result,pplVar10);
            return LY_EINVAL;
          }
          if (lVar17 == LY_STMT_DEVIATION) {
            pvVar7 = *result;
            if (pvVar7 == (void *)0x0) {
              plVar6 = (long *)malloc(0x30);
              if (plVar6 != (long *)0x0) {
                *plVar6 = 1;
                lVar15 = 1;
                goto LAB_00162c7b;
              }
            }
            else {
              lVar15 = *(long *)((long)pvVar7 + -8);
              *(long *)((long)pvVar7 + -8) = lVar15 + 1;
              plVar6 = (long *)realloc((void *)((long)pvVar7 + -8),lVar15 * 0x28 + 0x30);
              if (plVar6 != (long *)0x0) {
                lVar15 = *plVar6;
LAB_00162c7b:
                *result = plVar6 + 1;
                plVar6[lVar15 * 5 + -2] = 0;
                (plVar6 + lVar15 * 5 + -2)[1] = 0;
                plVar6[lVar15 * 5 + -4] = 0;
                (plVar6 + lVar15 * 5 + -4)[1] = 0;
                plVar6[lVar15 * 5] = 0;
                LVar3 = lysp_stmt_validate_value(pctx,Y_STR_ARG,stmt->arg);
                if (LVar3 == LY_SUCCESS) {
                  pplVar10 = (lysp_ext_instance **)(plVar6 + lVar15 * 5 + -4);
                  if (pctx == (lysp_ctx *)0x0) {
                    plVar13 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar13 = (ly_ctx *)
                              **(undefined8 **)
                                (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
                  }
                  plVar16 = (lysp_stmt *)stmt->arg;
                  LVar3 = lydict_insert(plVar13,(char *)plVar16,0,(char **)pplVar10);
                  if (LVar3 == LY_SUCCESS) {
                    yVar18 = (yang_arg)(plVar6 + lVar15 * 5);
                    LVar3 = LY_SUCCESS;
                    pplVar14 = &stmt->child;
                    result = extraout_RDX;
                    while (plVar1 = *pplVar14, plVar1 != (lysp_stmt *)0x0) {
                      lVar17 = plVar1->kw;
                      uVar12 = yVar18 - 0x18;
                      if (lVar17 == LY_STMT_DESCRIPTION) {
LAB_0016338f:
                        pplVar10 = (lysp_ext_instance **)0x2;
                        plVar16 = plVar1;
                        LVar5 = lysp_stmt_text_field(pctx,plVar1,uVar12,(char **)0x2,yVar18,in_R9);
                        result = extraout_RDX_00;
                      }
                      else {
                        if (lVar17 != LY_STMT_EXTENSION_INSTANCE) {
                          uVar12 = yVar18 - 0x10;
                          if (lVar17 == LY_STMT_REFERENCE) goto LAB_0016338f;
                          if (lVar17 == LY_STMT_DEVIATE) goto LAB_00163922;
                          if (pctx == (lysp_ctx *)0x0) {
                            plVar13 = (ly_ctx *)0x0;
                          }
                          else {
                            plVar13 = (ly_ctx *)
                                      **(undefined8 **)
                                        (pctx->parsed_mods->field_2).dnodes
                                        [pctx->parsed_mods->count - 1];
                          }
                          pcVar19 = lyplg_ext_stmt2str(lVar17);
                          lVar17 = LY_STMT_DEVIATION;
                          goto LAB_00163b0f;
                        }
                        pplVar10 = (lysp_ext_instance **)0x0;
                        plVar16 = plVar1;
                        LVar5 = lysp_stmt_ext(pctx,plVar1,stmt->kw,0,
                                              (lysp_ext_instance **)(plVar6 + lVar15 * 5));
                        result = extraout_RDX_01;
                      }
                      if (LVar5 != LY_SUCCESS) {
                        return LVar5;
                      }
                      pplVar14 = &plVar1->next;
                    }
                  }
                }
                return LVar3;
              }
              *(long *)((long)*result + -8) = *(long *)((long)*result + -8) + -1;
            }
            if (pctx == (lysp_ctx *)0x0) {
              plVar13 = (ly_ctx *)0x0;
            }
            else {
              plVar13 = (ly_ctx *)
                        **(undefined8 **)
                          (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
            }
            pcVar19 = "lysp_stmt_deviation";
            goto LAB_001626c4;
          }
          if (lVar17 == LY_STMT_ENUM) goto LAB_001622b6;
          if ((lVar17 == LY_STMT_ERROR_APP_TAG) || (lVar17 == LY_STMT_ERROR_MESSAGE))
          goto LAB_00162212;
          if (lVar17 == LY_STMT_EXTENSION) {
            pvVar7 = *result;
            if (pvVar7 == (void *)0x0) {
              plVar6 = (long *)malloc(0x40);
              if (plVar6 != (long *)0x0) {
                *plVar6 = 1;
                lVar15 = 1;
                goto LAB_00162e0c;
              }
            }
            else {
              lVar15 = *(long *)((long)pvVar7 + -8);
              *(long *)((long)pvVar7 + -8) = lVar15 + 1;
              plVar6 = (long *)realloc((void *)((long)pvVar7 + -8),lVar15 * 0x38 + 0x40);
              if (plVar6 != (long *)0x0) {
                lVar15 = *plVar6;
LAB_00162e0c:
                *result = plVar6 + 1;
                plVar6[lVar15 * 7 + -2] = 0;
                (plVar6 + lVar15 * 7 + -2)[1] = 0;
                plVar6[lVar15 * 7 + -4] = 0;
                (plVar6 + lVar15 * 7 + -4)[1] = 0;
                plVar6[lVar15 * 7 + -6] = 0;
                (plVar6 + lVar15 * 7 + -6)[1] = 0;
                plVar6[lVar15 * 7] = 0;
                LVar3 = lysp_stmt_validate_value(pctx,Y_IDENTIF_ARG,stmt->arg);
                if (LVar3 != LY_SUCCESS) {
                  return LVar3;
                }
                if (pctx == (lysp_ctx *)0x0) {
                  plVar13 = (ly_ctx *)0x0;
                }
                else {
                  plVar13 = (ly_ctx *)
                            **(undefined8 **)
                              (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
                }
                LVar3 = lydict_insert(plVar13,stmt->arg,0,(char **)(plVar6 + lVar15 * 7 + -6));
                if (LVar3 != LY_SUCCESS) {
                  return LVar3;
                }
                pplVar14 = &stmt->child;
                pplVar10 = (lysp_ext_instance **)(plVar6 + lVar15 * 7 + -2);
                local_50 = (char **)(plVar6 + lVar15 * 7 + -5);
                local_40 = (lysp_qname **)(plVar6 + lVar15 * 7 + -3);
                local_48 = (lysp_ext_instance **)(plVar6 + lVar15 * 7 + -4);
                do {
                  plVar16 = *pplVar14;
                  if (plVar16 == (lysp_stmt *)0x0) {
                    return LY_SUCCESS;
                  }
                  lVar17 = plVar16->kw;
                  if (lVar17 == LY_STMT_ARGUMENT) {
                    if (*local_50 != (char *)0x0) {
                      if (pctx == (lysp_ctx *)0x0) {
                        plVar13 = (ly_ctx *)0x0;
                      }
                      else {
                        plVar13 = (ly_ctx *)
                                  **(undefined8 **)
                                    (pctx->parsed_mods->field_2).dnodes
                                    [pctx->parsed_mods->count - 1];
                      }
                      pcVar19 = "argument";
                      goto LAB_00162eee;
                    }
                    LVar3 = lysp_stmt_validate_value(pctx,Y_PREF_IDENTIF_ARG,plVar16->arg);
                    if (LVar3 != LY_SUCCESS) {
                      return LVar3;
                    }
                    if (pctx == (lysp_ctx *)0x0) {
                      plVar13 = (ly_ctx *)0x0;
                    }
                    else {
                      plVar13 = (ly_ctx *)
                                **(undefined8 **)
                                  (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
                    }
                    LVar3 = lydict_insert(plVar13,plVar16->arg,0,local_50);
                    if (LVar3 != LY_SUCCESS) {
                      return LVar3;
                    }
                    pplVar14 = &plVar16->child;
                    while (plVar1 = *pplVar14, plVar1 != (lysp_stmt *)0x0) {
                      lVar17 = plVar1->kw;
                      if (lVar17 == LY_STMT_EXTENSION_INSTANCE) {
                        LVar3 = lysp_stmt_ext(pctx,plVar1,plVar16->kw,0,pplVar10);
                      }
                      else {
                        if (lVar17 != LY_STMT_YIN_ELEMENT) {
                          if (pctx == (lysp_ctx *)0x0) {
                            plVar13 = (ly_ctx *)0x0;
                          }
                          else {
                            plVar13 = (ly_ctx *)
                                      **(undefined8 **)
                                        (pctx->parsed_mods->field_2).dnodes
                                        [pctx->parsed_mods->count - 1];
                          }
                          pcVar19 = lyplg_ext_stmt2str(lVar17);
                          lVar17 = LY_STMT_ARGUMENT;
                          goto LAB_00163b0f;
                        }
                        LVar3 = lysp_stmt_yinelem(pctx,plVar1,(uint16_t *)(plVar6 + lVar15 * 7 + -1)
                                                  ,pplVar10);
                      }
                      if (LVar3 != LY_SUCCESS) {
                        return LVar3;
                      }
                      pplVar14 = &plVar1->next;
                    }
                  }
                  else {
                    if (lVar17 == LY_STMT_STATUS) {
                      LVar3 = lysp_stmt_status(pctx,plVar16,(uint16_t *)(plVar6 + lVar15 * 7 + -1),
                                               pplVar10);
                    }
                    else if (lVar17 == LY_STMT_EXTENSION_INSTANCE) {
                      LVar3 = lysp_stmt_ext(pctx,plVar16,stmt->kw,0,pplVar10);
                    }
                    else {
                      if (lVar17 == LY_STMT_REFERENCE) {
                        uVar12 = (uint32_t)local_40;
                      }
                      else {
                        if (lVar17 != LY_STMT_DESCRIPTION) {
                          if (pctx == (lysp_ctx *)0x0) {
                            plVar13 = (ly_ctx *)0x0;
                          }
                          else {
                            plVar13 = (ly_ctx *)
                                      **(undefined8 **)
                                        (pctx->parsed_mods->field_2).dnodes
                                        [pctx->parsed_mods->count - 1];
                          }
                          pcVar19 = lyplg_ext_stmt2str(lVar17);
                          lVar17 = LY_STMT_EXTENSION;
                          goto LAB_00163b0f;
                        }
                        uVar12 = (uint32_t)local_48;
                      }
                      LVar3 = lysp_stmt_text_field
                                        (pctx,plVar16,uVar12,(char **)0x2,(yang_arg)pplVar10,in_R9);
                    }
                    if (LVar3 != LY_SUCCESS) {
                      return LVar3;
                    }
                  }
                  pplVar14 = &plVar16->next;
                } while( true );
              }
              *(long *)((long)*result + -8) = *(long *)((long)*result + -8) + -1;
            }
            if (pctx == (lysp_ctx *)0x0) {
              plVar13 = (ly_ctx *)0x0;
            }
            else {
              plVar13 = (ly_ctx *)
                        **(undefined8 **)
                          (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
            }
            pcVar19 = "lysp_stmt_extension";
            goto LAB_001626c4;
          }
          if (lVar17 == LY_STMT_EXTENSION_INSTANCE) {
            LVar3 = lysp_stmt_ext(pctx,stmt,LY_STMT_EXTENSION_INSTANCE,0,
                                  (lysp_ext_instance **)result);
            return LVar3;
          }
          if (lVar17 == LY_STMT_FEATURE) {
            pvVar7 = *result;
            if (pvVar7 == (void *)0x0) {
              plVar6 = (long *)malloc(0x48);
              if (plVar6 != (long *)0x0) {
                *plVar6 = 1;
                lVar15 = 1;
                goto LAB_00162a06;
              }
            }
            else {
              lVar15 = *(long *)((long)pvVar7 + -8) + 1;
              *(long *)((long)pvVar7 + -8) = lVar15;
              plVar6 = (long *)realloc((void *)((long)pvVar7 + -8),lVar15 * 0x40 | 8);
              if (plVar6 != (long *)0x0) {
                lVar15 = *plVar6;
LAB_00162a06:
                *result = plVar6 + 1;
                plVar6[lVar15 * 8 + -1] = 0;
                (plVar6 + lVar15 * 8 + -1)[1] = 0;
                plVar6[lVar15 * 8 + -3] = 0;
                (plVar6 + lVar15 * 8 + -3)[1] = 0;
                plVar6[lVar15 * 8 + -5] = 0;
                (plVar6 + lVar15 * 8 + -5)[1] = 0;
                plVar6[lVar15 * 8 + -7] = 0;
                (plVar6 + lVar15 * 8 + -7)[1] = 0;
                LVar3 = lysp_stmt_validate_value(pctx,Y_IDENTIF_ARG,stmt->arg);
                if (LVar3 != LY_SUCCESS) {
                  return LVar3;
                }
                if (pctx == (lysp_ctx *)0x0) {
                  plVar13 = (ly_ctx *)0x0;
                }
                else {
                  plVar13 = (ly_ctx *)
                            **(undefined8 **)
                              (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
                }
                LVar3 = lydict_insert(plVar13,stmt->arg,0,(char **)(plVar6 + lVar15 * 8 + -7));
                if (LVar3 != LY_SUCCESS) {
                  return LVar3;
                }
                plVar6 = plVar6 + lVar15 * 8 + 1;
                pplVar14 = &stmt->child;
                pplVar10 = (lysp_ext_instance **)(plVar6 + -2);
                local_50 = (char **)(plVar6 + -3);
                local_48 = (lysp_ext_instance **)(plVar6 + -7);
                do {
                  plVar16 = *pplVar14;
                  if (plVar16 == (lysp_stmt *)0x0) {
                    return LY_SUCCESS;
                  }
                  lVar17 = plVar16->kw;
                  if (lVar17 == LY_STMT_STATUS) {
                    LVar3 = lysp_stmt_status(pctx,plVar16,(uint16_t *)(plVar6 + -1),pplVar10);
                  }
                  else if (lVar17 == LY_STMT_EXTENSION_INSTANCE) {
                    in_R8 = pplVar10;
                    LVar3 = lysp_stmt_ext(pctx,plVar16,stmt->kw,0,pplVar10);
                  }
                  else if (lVar17 == LY_STMT_IF_FEATURE) {
                    LVar3 = lysp_stmt_qnames(pctx,plVar16,(lysp_qname **)local_48,(yang_arg)pplVar10
                                             ,in_R8);
                  }
                  else {
                    if (lVar17 == LY_STMT_REFERENCE) {
                      uVar12 = (uint32_t)local_50;
                    }
                    else {
                      uVar12 = (int)plVar6 - 0x20;
                      if (lVar17 != LY_STMT_DESCRIPTION) {
                        if (pctx == (lysp_ctx *)0x0) {
                          plVar13 = (ly_ctx *)0x0;
                        }
                        else {
                          plVar13 = (ly_ctx *)
                                    **(undefined8 **)
                                      (pctx->parsed_mods->field_2).dnodes
                                      [pctx->parsed_mods->count - 1];
                        }
                        pcVar19 = lyplg_ext_stmt2str(lVar17);
                        lVar17 = LY_STMT_FEATURE;
                        goto LAB_00163b0f;
                      }
                    }
                    in_R8 = pplVar10;
                    LVar3 = lysp_stmt_text_field
                                      (pctx,plVar16,uVar12,(char **)0x2,(yang_arg)pplVar10,in_R9);
                  }
                  if (LVar3 != LY_SUCCESS) {
                    return LVar3;
                  }
                  pplVar14 = &plVar16->next;
                } while( true );
              }
              *(long *)((long)*result + -8) = *(long *)((long)*result + -8) + -1;
            }
            if (pctx == (lysp_ctx *)0x0) {
              plVar13 = (ly_ctx *)0x0;
            }
            else {
              plVar13 = (ly_ctx *)
                        **(undefined8 **)
                          (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
            }
            pcVar19 = "lysp_stmt_feature";
            goto LAB_001626c4;
          }
          if (lVar17 == LY_STMT_FRACTION_DIGITS) {
            LVar3 = lysp_stmt_type_fracdigits
                              (pctx,stmt,(uint8_t *)*result,(lysp_ext_instance **)0x0);
            return LVar3;
          }
          if (lVar17 == LY_STMT_IDENTITY) {
            pvVar7 = *result;
            if (pvVar7 == (void *)0x0) {
              plVar6 = (long *)malloc(0x40);
              if (plVar6 != (long *)0x0) {
                *plVar6 = 1;
                lVar15 = 1;
                goto LAB_00162bf3;
              }
            }
            else {
              lVar15 = *(long *)((long)pvVar7 + -8);
              *(long *)((long)pvVar7 + -8) = lVar15 + 1;
              plVar6 = (long *)realloc((void *)((long)pvVar7 + -8),lVar15 * 0x38 + 0x40);
              if (plVar6 != (long *)0x0) {
                lVar15 = *plVar6;
LAB_00162bf3:
                *result = plVar6 + 1;
                plVar6[lVar15 * 7 + -2] = 0;
                (plVar6 + lVar15 * 7 + -2)[1] = 0;
                plVar6[lVar15 * 7 + -4] = 0;
                (plVar6 + lVar15 * 7 + -4)[1] = 0;
                plVar6[lVar15 * 7 + -6] = 0;
                (plVar6 + lVar15 * 7 + -6)[1] = 0;
                plVar6[lVar15 * 7] = 0;
                LVar3 = lysp_stmt_validate_value(pctx,Y_IDENTIF_ARG,stmt->arg);
                if (LVar3 != LY_SUCCESS) {
                  return LVar3;
                }
                if (pctx == (lysp_ctx *)0x0) {
                  plVar13 = (ly_ctx *)0x0;
                }
                else {
                  plVar13 = (ly_ctx *)
                            **(undefined8 **)
                              (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
                }
                LVar3 = lydict_insert(plVar13,stmt->arg,0,(char **)(plVar6 + lVar15 * 7 + -6));
                if (LVar3 != LY_SUCCESS) {
                  return LVar3;
                }
                local_50 = (char **)(plVar6 + lVar15 * 7);
                pplVar14 = &stmt->child;
                pplVar10 = (lysp_ext_instance **)(local_50 + -1);
                texts = (char ***)(local_50 + -4);
                local_48 = (lysp_ext_instance **)(local_50 + -2);
                local_40 = (lysp_qname **)(local_50 + -5);
                iVar4 = (int)local_50;
                do {
                  plVar16 = *pplVar14;
                  if (plVar16 == (lysp_stmt *)0x0) {
                    return LY_SUCCESS;
                  }
                  lVar17 = plVar16->kw;
                  yVar18 = (yang_arg)pplVar10;
                  if (lVar17 == LY_STMT_BASE) {
                    LVar3 = lysp_stmt_text_fields(pctx,plVar16,texts,yVar18,in_R8);
                  }
                  else if (lVar17 == LY_STMT_STATUS) {
                    LVar3 = lysp_stmt_status(pctx,plVar16,(uint16_t *)local_50,pplVar10);
                  }
                  else if (lVar17 == LY_STMT_EXTENSION_INSTANCE) {
                    in_R8 = pplVar10;
                    LVar3 = lysp_stmt_ext(pctx,plVar16,stmt->kw,0,pplVar10);
                  }
                  else if (lVar17 == LY_STMT_IF_FEATURE) {
                    LVar3 = lysp_stmt_qnames(pctx,plVar16,local_40,yVar18,in_R8);
                  }
                  else {
                    if (lVar17 == LY_STMT_REFERENCE) {
                      uVar12 = (uint32_t)local_48;
                    }
                    else {
                      uVar12 = iVar4 - 0x18;
                      if (lVar17 != LY_STMT_DESCRIPTION) {
                        if (pctx == (lysp_ctx *)0x0) {
                          plVar13 = (ly_ctx *)0x0;
                        }
                        else {
                          plVar13 = (ly_ctx *)
                                    **(undefined8 **)
                                      (pctx->parsed_mods->field_2).dnodes
                                      [pctx->parsed_mods->count - 1];
                        }
                        pcVar19 = lyplg_ext_stmt2str(lVar17);
                        lVar17 = LY_STMT_IDENTITY;
                        goto LAB_00163b0f;
                      }
                    }
                    in_R8 = pplVar10;
                    LVar3 = lysp_stmt_text_field(pctx,plVar16,uVar12,(char **)0x2,yVar18,in_R9);
                  }
                  if (LVar3 != LY_SUCCESS) {
                    return LVar3;
                  }
                  pplVar14 = &plVar16->next;
                } while( true );
              }
              *(long *)((long)*result + -8) = *(long *)((long)*result + -8) + -1;
            }
            if (pctx == (lysp_ctx *)0x0) {
              plVar13 = (ly_ctx *)0x0;
            }
            else {
              plVar13 = (ly_ctx *)
                        **(undefined8 **)
                          (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
            }
            pcVar19 = "lysp_stmt_identity";
            goto LAB_001626c4;
          }
          if (lVar17 == LY_STMT_IF_FEATURE) goto LAB_0016227a;
          if (lVar17 == LY_STMT_IMPORT) {
            _flags = (char *)0x0;
            pvVar7 = *result;
            if (pvVar7 == (void *)0x0) {
              plVar6 = (long *)malloc(0x48);
              if (plVar6 != (long *)0x0) {
                *plVar6 = 1;
                lVar15 = 1;
                goto LAB_00162cfe;
              }
            }
            else {
              lVar15 = *(long *)((long)pvVar7 + -8) + 1;
              *(long *)((long)pvVar7 + -8) = lVar15;
              plVar6 = (long *)realloc((void *)((long)pvVar7 + -8),lVar15 * 0x40 | 8);
              if (plVar6 != (long *)0x0) {
                lVar15 = *plVar6;
LAB_00162cfe:
                *result = plVar6 + 1;
                plVar6[lVar15 * 8 + -1] = 0;
                (plVar6 + lVar15 * 8 + -1)[1] = 0;
                plVar6[lVar15 * 8 + -3] = 0;
                (plVar6 + lVar15 * 8 + -3)[1] = 0;
                plVar6[lVar15 * 8 + -5] = 0;
                (plVar6 + lVar15 * 8 + -5)[1] = 0;
                plVar6[lVar15 * 8 + -7] = 0;
                (plVar6 + lVar15 * 8 + -7)[1] = 0;
                LVar3 = lysp_stmt_validate_value(pctx,Y_IDENTIF_ARG,stmt->arg);
                if (LVar3 != LY_SUCCESS) {
                  return LVar3;
                }
                if (pctx == (lysp_ctx *)0x0) {
                  plVar13 = (ly_ctx *)0x0;
                }
                else {
                  plVar13 = (ly_ctx *)
                            **(undefined8 **)
                              (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
                }
                LVar3 = lydict_insert(plVar13,stmt->arg,0,(char **)(plVar6 + lVar15 * 8 + -6));
                if (LVar3 != LY_SUCCESS) {
                  return LVar3;
                }
                pplVar14 = &stmt->child;
                local_50 = (char **)((long)plVar6 + lVar15 * 0x40 + -6);
                local_48 = (lysp_ext_instance **)(plVar6 + lVar15 * 8 + -3);
                local_40 = (lysp_qname **)(plVar6 + lVar15 * 8 + -4);
                ppcVar11 = (char **)(plVar6 + lVar15 * 8 + -5);
                local_38 = ppcVar11;
                do {
                  plVar16 = *pplVar14;
                  if (plVar16 == (lysp_stmt *)0x0) {
                    return LY_SUCCESS;
                  }
                  lVar17 = plVar16->kw;
                  yVar18 = (yang_arg)(plVar6 + lVar15 * 8 + -2);
                  if (lVar17 == LY_STMT_DESCRIPTION) {
                    uVar12 = (uint32_t)local_40;
LAB_00163507:
                    LVar5 = lysp_stmt_text_field(pctx,plVar16,uVar12,(char **)0x2,yVar18,in_R9);
                    LVar3 = LVar5;
                  }
                  else if (lVar17 == LY_STMT_EXTENSION_INSTANCE) {
                    LVar5 = lysp_stmt_ext(pctx,plVar16,stmt->kw,0,
                                          (lysp_ext_instance **)(plVar6 + lVar15 * 8 + -2));
                    LVar3 = LVar5;
                  }
                  else if (lVar17 == LY_STMT_REVISION_DATE) {
                    LVar3 = lysp_stmt_text_field
                                      (pctx,stmt,(uint32_t)&flags,(char **)0x2,yVar18,in_R9);
                    pcVar19 = _flags;
                    if (LVar3 != LY_SUCCESS) {
                      return LVar3;
                    }
                    strcpy((char *)local_50,_flags);
                    if (pctx == (lysp_ctx *)0x0) {
                      plVar13 = (ly_ctx *)0x0;
                    }
                    else {
                      plVar13 = (ly_ctx *)
                                **(undefined8 **)
                                  (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
                    }
                    lydict_remove(plVar13,pcVar19);
                    LVar5 = lysp_check_date(pctx,(char *)local_50,10,"revision-date");
                    ppcVar11 = local_38;
                    LVar3 = LVar5;
                  }
                  else {
                    if (lVar17 == LY_STMT_REFERENCE) {
                      uVar12 = (uint32_t)local_48;
                      goto LAB_00163507;
                    }
                    if (lVar17 != LY_STMT_PREFIX) {
                      if (pctx == (lysp_ctx *)0x0) {
                        plVar13 = (ly_ctx *)0x0;
                      }
                      else {
                        plVar13 = (ly_ctx *)
                                  **(undefined8 **)
                                    (pctx->parsed_mods->field_2).dnodes
                                    [pctx->parsed_mods->count - 1];
                      }
                      pcVar19 = lyplg_ext_stmt2str(lVar17);
                      pcVar9 = lyplg_ext_stmt2str(LY_STMT_IMPORT);
                      ly_vlog(plVar13,(char *)0x0,LYVE_SYNTAX_YANG,
                              "Invalid keyword \"%s\" as a child of \"%s\".",pcVar19,pcVar9);
                      return LY_EVALID;
                    }
                    LVar3 = lysp_stmt_text_field
                                      (pctx,plVar16,(uint32_t)ppcVar11,(char **)0x0,yVar18,in_R9);
                    if (LVar3 != LY_SUCCESS) {
                      return LVar3;
                    }
                    LVar5 = lysp_check_prefix(pctx,(lysp_import *)*result,(char *)0x0,ppcVar11);
                    LVar3 = LY_EVALID;
                  }
                  if (LVar5 != LY_SUCCESS) {
                    return LVar3;
                  }
                  pplVar14 = &plVar16->next;
                } while( true );
              }
              *(long *)((long)*result + -8) = *(long *)((long)*result + -8) + -1;
            }
            if (pctx == (lysp_ctx *)0x0) {
              plVar13 = (ly_ctx *)0x0;
            }
            else {
              plVar13 = (ly_ctx *)
                        **(undefined8 **)
                          (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
            }
            pcVar19 = "lysp_stmt_import";
            goto LAB_001626c4;
          }
          if (lVar17 == LY_STMT_INCLUDE) {
            _flags = (char *)0x0;
            pvVar7 = *result;
            if (pvVar7 == (void *)0x0) {
              plVar6 = (long *)malloc(0x40);
              if (plVar6 != (long *)0x0) {
                *plVar6 = 1;
                lVar15 = 1;
                goto LAB_00162d85;
              }
            }
            else {
              lVar15 = *(long *)((long)pvVar7 + -8);
              *(long *)((long)pvVar7 + -8) = lVar15 + 1;
              plVar6 = (long *)realloc((void *)((long)pvVar7 + -8),lVar15 * 0x38 + 0x40);
              if (plVar6 != (long *)0x0) {
                lVar15 = *plVar6;
LAB_00162d85:
                *result = plVar6 + 1;
                plVar6[lVar15 * 7 + -2] = 0;
                (plVar6 + lVar15 * 7 + -2)[1] = 0;
                plVar6[lVar15 * 7 + -4] = 0;
                (plVar6 + lVar15 * 7 + -4)[1] = 0;
                plVar6[lVar15 * 7 + -6] = 0;
                (plVar6 + lVar15 * 7 + -6)[1] = 0;
                plVar6[lVar15 * 7] = 0;
                LVar3 = lysp_stmt_validate_value(pctx,Y_IDENTIF_ARG,stmt->arg);
                if (LVar3 != LY_SUCCESS) {
                  return LVar3;
                }
                plVar6 = plVar6 + lVar15 * 7;
                if (pctx == (lysp_ctx *)0x0) {
                  plVar13 = (ly_ctx *)0x0;
                }
                else {
                  plVar13 = (ly_ctx *)
                            **(undefined8 **)
                              (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
                }
                LVar3 = lydict_insert(plVar13,stmt->arg,0,(char **)(plVar6 + -5));
                if (LVar3 != LY_SUCCESS) {
                  return LVar3;
                }
                pplVar14 = &stmt->child;
                pplVar10 = (lysp_ext_instance **)(plVar6 + -2);
                local_50 = (char **)(plVar6 + -3);
                local_48 = pplVar10;
                do {
                  plVar16 = *pplVar14;
                  if (plVar16 == (lysp_stmt *)0x0) {
                    return LY_SUCCESS;
                  }
                  lVar17 = plVar16->kw;
                  if (lVar17 == LY_STMT_REVISION_DATE) {
                    LVar3 = lysp_stmt_text_field
                                      (pctx,stmt,(uint32_t)&flags,(char **)0x2,(yang_arg)pplVar10,
                                       in_R9);
                    pcVar19 = _flags;
                    if (LVar3 != LY_SUCCESS) {
                      return LVar3;
                    }
                    strcpy((char *)(plVar6 + -1),_flags);
                    if (pctx == (lysp_ctx *)0x0) {
                      plVar13 = (ly_ctx *)0x0;
                    }
                    else {
                      plVar13 = (ly_ctx *)
                                **(undefined8 **)
                                  (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
                    }
                    lydict_remove(plVar13,pcVar19);
                    LVar3 = lysp_check_date(pctx,(char *)(plVar6 + -1),10,"revision-date");
                    pplVar10 = local_48;
                  }
                  else if (lVar17 == LY_STMT_EXTENSION_INSTANCE) {
                    LVar3 = lysp_stmt_ext(pctx,plVar16,stmt->kw,0,pplVar10);
                  }
                  else {
                    if (lVar17 == LY_STMT_REFERENCE) {
                      uVar12 = (uint32_t)local_50;
                    }
                    else {
                      uVar12 = (int)plVar6 - 0x20;
                      if (lVar17 != LY_STMT_DESCRIPTION) {
                        if (pctx == (lysp_ctx *)0x0) {
                          plVar13 = (ly_ctx *)0x0;
                        }
                        else {
                          plVar13 = (ly_ctx *)
                                    **(undefined8 **)
                                      (pctx->parsed_mods->field_2).dnodes
                                      [pctx->parsed_mods->count - 1];
                        }
                        pcVar19 = lyplg_ext_stmt2str(lVar17);
                        lVar17 = LY_STMT_INCLUDE;
                        goto LAB_00163b0f;
                      }
                    }
                    LVar3 = lysp_stmt_text_field
                                      (pctx,plVar16,uVar12,(char **)0x2,(yang_arg)pplVar10,in_R9);
                  }
                  if (LVar3 != LY_SUCCESS) {
                    return LVar3;
                  }
                  pplVar14 = &plVar16->next;
                } while( true );
              }
              *(long *)((long)*result + -8) = *(long *)((long)*result + -8) + -1;
            }
            if (pctx == (lysp_ctx *)0x0) {
              plVar13 = (ly_ctx *)0x0;
            }
            else {
              plVar13 = (ly_ctx *)
                        **(undefined8 **)
                          (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
            }
            pcVar19 = "lysp_stmt_include";
            goto LAB_001626c4;
          }
          if (lVar17 == LY_STMT_KEY) goto LAB_00162212;
          if (lVar17 == LY_STMT_LENGTH) {
LAB_001622f2:
            restr = (lysp_restr *)calloc(1,0x40);
            *result = restr;
            if (restr != (lysp_restr *)0x0) {
              LVar3 = lysp_stmt_restr(pctx,stmt,restr);
              return LVar3;
            }
            goto LAB_00162696;
          }
          if (lVar17 == LY_STMT_MANDATORY) {
            LVar3 = lysp_stmt_mandatory(pctx,stmt,(uint16_t *)*result,(lysp_ext_instance **)0x0);
            return LVar3;
          }
          if (lVar17 == LY_STMT_MAX_ELEMENTS) {
            _flags = (char *)((ulong)uStack_56 << 0x10);
            LVar3 = lysp_stmt_maxelements
                              (pctx,stmt,(uint32_t *)*result,&flags,(lysp_ext_instance **)0x0);
            return LVar3;
          }
          if (lVar17 == LY_STMT_MIN_ELEMENTS) {
            _flags = (char *)((ulong)uStack_56 << 0x10);
            LVar3 = lysp_stmt_minelements
                              (pctx,stmt,(uint32_t *)*result,&flags,(lysp_ext_instance **)0x0);
            return LVar3;
          }
          if (lVar17 == LY_STMT_MODIFIER) {
            LVar3 = lysp_stmt_type_pattern_modifier
                              (pctx,stmt,(char **)result,(lysp_ext_instance **)0x0);
            return LVar3;
          }
          if (lVar17 == LY_STMT_MODULE) {
            pvVar7 = calloc(1,0x80);
            *result = pvVar7;
            if (pvVar7 != (void *)0x0) {
              if (pctx == (lysp_ctx *)0x0) {
                plVar13 = (ly_ctx *)0x0;
              }
              else {
                plVar13 = (ly_ctx *)
                          **(undefined8 **)
                            (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
              }
              pcVar19 = "Extension instance \"module\" substatement is not supported.";
LAB_00162f08:
              ly_log(plVar13,LY_LLERR,LY_EINVAL,pcVar19);
              return LY_EINVAL;
            }
            goto LAB_00162696;
          }
          if (lVar17 == LY_STMT_MUST) {
            LVar3 = lysp_stmt_restrs(pctx,stmt,(lysp_restr **)result);
            return LVar3;
          }
          if (lVar17 != LY_STMT_NAMESPACE) {
            if (lVar17 == LY_STMT_ORDERED_BY) {
              LVar3 = lysp_stmt_orderedby(pctx,stmt,(uint16_t *)*result,(lysp_ext_instance **)0x0);
              return LVar3;
            }
            if (lVar17 != LY_STMT_ORGANIZATION) {
              if (lVar17 == LY_STMT_PATH) {
                _flags = (char *)0x0;
                LVar3 = lysp_stmt_text_field
                                  (pctx,stmt,(uint32_t)&flags,(char **)0x2,Y_IDENTIF_ARG,in_R9);
                if (LVar3 == LY_SUCCESS) {
                  if (pctx == (lysp_ctx *)0x0) {
                    plVar13 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar13 = (ly_ctx *)
                              **(undefined8 **)
                                (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
                  }
                  ctx = (ly_ctx *)0x0;
                  LVar3 = ly_path_parse(plVar13,(lysc_node *)0x0,_flags,0,'\x01',2,0x10,0x400,
                                        (lyxp_expr **)result);
                  if (pctx != (lysp_ctx *)0x0) {
                    ctx = (ly_ctx *)
                          **(undefined8 **)
                            (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
                  }
                  lydict_remove(ctx,_flags);
                  return LVar3;
                }
                return LVar3;
              }
              if (lVar17 == LY_STMT_PATTERN) {
                LVar3 = lysp_stmt_type_pattern(pctx,stmt,(lysp_restr **)result);
                return LVar3;
              }
              if (lVar17 == LY_STMT_POSITION) {
LAB_001622d2:
                _flags = (char *)((ulong)uStack_56 << 0x10);
                LVar3 = lysp_stmt_type_enum_value_pos
                                  (pctx,stmt,(int64_t *)*result,&flags,(lysp_ext_instance **)0x0);
                return LVar3;
              }
              if (lVar17 == LY_STMT_PREFIX) {
                ppcVar11 = (char **)0x0;
                goto LAB_0016221e;
              }
              if (lVar17 != LY_STMT_PRESENCE) {
                if (lVar17 == LY_STMT_RANGE) goto LAB_001622f2;
                if (lVar17 != LY_STMT_REFERENCE) {
                  if (lVar17 == LY_STMT_REFINE) {
                    LVar3 = lysp_stmt_refine(pctx,stmt,(lysp_refine **)result);
                    return LVar3;
                  }
                  if (lVar17 == LY_STMT_REQUIRE_INSTANCE) {
                    _flags = (char *)((ulong)uStack_56 << 0x10);
                    LVar3 = lysp_stmt_type_reqinstance
                                      (pctx,stmt,(uint8_t *)*result,&flags,(lysp_ext_instance **)0x0
                                      );
                    return LVar3;
                  }
                  if (lVar17 == LY_STMT_REVISION) {
                    pvVar7 = *result;
                    if (pvVar7 == (void *)0x0) {
                      plVar6 = (long *)malloc(0x30);
                      if (plVar6 != (long *)0x0) {
                        lVar15 = 1;
                        *plVar6 = 1;
                        goto LAB_00162a92;
                      }
                    }
                    else {
                      lVar15 = *(long *)((long)pvVar7 + -8);
                      *(long *)((long)pvVar7 + -8) = lVar15 + 1;
                      plVar6 = (long *)realloc((void *)((long)pvVar7 + -8),lVar15 * 0x28 + 0x30);
                      if (plVar6 != (long *)0x0) {
                        lVar15 = *plVar6;
LAB_00162a92:
                        *result = plVar6 + 1;
                        plVar6[lVar15 * 5 + -2] = 0;
                        (plVar6 + lVar15 * 5 + -2)[1] = 0;
                        plVar6[lVar15 * 5 + -4] = 0;
                        (plVar6 + lVar15 * 5 + -4)[1] = 0;
                        plVar6[lVar15 * 5] = 0;
                        pcVar19 = stmt->arg;
                        sVar8 = strlen(pcVar19);
                        LVar3 = lysp_check_date(pctx,pcVar19,sVar8,"revision");
                        if (LVar3 != LY_SUCCESS) {
                          return LVar3;
                        }
                        plVar20 = plVar6 + lVar15 * 5 + 1;
                        strncpy((char *)(plVar6 + lVar15 * 5 + -4),stmt->arg,10);
                        pplVar14 = &stmt->child;
                        do {
                          plVar16 = *pplVar14;
                          if (plVar16 == (lysp_stmt *)0x0) {
                            return LY_SUCCESS;
                          }
                          lVar17 = plVar16->kw;
                          uVar12 = (int)plVar20 - 0x10;
                          if (lVar17 == LY_STMT_REFERENCE) {
LAB_00162b6b:
                            LVar3 = lysp_stmt_text_field
                                              (pctx,plVar16,uVar12,(char **)0x2,
                                               (yang_arg)(plVar20 + -1),in_R9);
                          }
                          else {
                            if (lVar17 != LY_STMT_EXTENSION_INSTANCE) {
                              uVar12 = (int)plVar20 - 0x18;
                              if (lVar17 == LY_STMT_DESCRIPTION) goto LAB_00162b6b;
                              if (pctx == (lysp_ctx *)0x0) {
                                plVar13 = (ly_ctx *)0x0;
                              }
                              else {
                                plVar13 = (ly_ctx *)
                                          **(undefined8 **)
                                            (pctx->parsed_mods->field_2).dnodes
                                            [pctx->parsed_mods->count - 1];
                              }
                              pcVar19 = lyplg_ext_stmt2str(lVar17);
                              lVar17 = LY_STMT_REVISION;
                              goto LAB_00163b0f;
                            }
                            LVar3 = lysp_stmt_ext(pctx,plVar16,stmt->kw,0,
                                                  (lysp_ext_instance **)(plVar20 + -1));
                          }
                          if (LVar3 != LY_SUCCESS) {
                            return LVar3;
                          }
                          pplVar14 = &plVar16->next;
                        } while( true );
                      }
                      *(long *)((long)*result + -8) = *(long *)((long)*result + -8) + -1;
                    }
                    if (pctx == (lysp_ctx *)0x0) {
                      plVar13 = (ly_ctx *)0x0;
                    }
                    else {
                      plVar13 = (ly_ctx *)
                                **(undefined8 **)
                                  (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
                    }
                    pcVar19 = "lysp_stmt_revision";
                    goto LAB_001626c4;
                  }
                  if (lVar17 != LY_STMT_REVISION_DATE) {
                    if (lVar17 == LY_STMT_STATUS) {
                      LVar3 = lysp_stmt_status(pctx,stmt,(uint16_t *)result,
                                               (lysp_ext_instance **)0x0);
                      return LVar3;
                    }
                    if (lVar17 == LY_STMT_SUBMODULE) {
                      pvVar7 = calloc(1,0xb8);
                      *result = pvVar7;
                      if (pvVar7 != (void *)0x0) {
                        if (pctx == (lysp_ctx *)0x0) {
                          plVar13 = (ly_ctx *)0x0;
                        }
                        else {
                          plVar13 = (ly_ctx *)
                                    **(undefined8 **)
                                      (pctx->parsed_mods->field_2).dnodes
                                      [pctx->parsed_mods->count - 1];
                        }
                        pcVar19 = "Extension instance \"submodule\" substatement is not supported.";
                        goto LAB_00162f08;
                      }
                    }
                    else {
                      if (lVar17 != LY_STMT_TYPE) {
                        if (lVar17 == LY_STMT_TYPEDEF) {
                          LVar3 = lysp_stmt_typedef(pctx,stmt,(lysp_node *)0x0,(lysp_tpdf **)result)
                          ;
                          return LVar3;
                        }
                        if (lVar17 == LY_STMT_UNIQUE) goto LAB_0016227a;
                        if (lVar17 != LY_STMT_UNITS) {
                          if (lVar17 != LY_STMT_VALUE) {
                            if (lVar17 == LY_STMT_WHEN) {
                              LVar3 = lysp_stmt_when(pctx,stmt,(lysp_when **)result);
                              return LVar3;
                            }
                            if (lVar17 == LY_STMT_YANG_VERSION) {
                              pcVar19 = (char *)*result;
                              if (*pcVar19 != '\0') {
                                if (pctx == (lysp_ctx *)0x0) {
                                  plVar13 = (ly_ctx *)0x0;
                                }
                                else {
                                  plVar13 = (ly_ctx *)
                                            **(undefined8 **)
                                              (pctx->parsed_mods->field_2).dnodes
                                              [pctx->parsed_mods->count - 1];
                                }
                                pcVar19 = "yin-element";
LAB_00162eee:
                                ly_vlog(plVar13,(char *)0x0,LYVE_SYNTAX_YANG,
                                        "Duplicate keyword \"%s\".",pcVar19);
                                return LY_EVALID;
                              }
                              pcVar9 = stmt->arg;
                              if ((*pcVar9 == '1') && (pcVar9[1] == '\0')) {
                                cVar2 = '\x01';
                              }
                              else {
                                iVar4 = strcmp(pcVar9,"1.1");
                                if (iVar4 != 0) {
                                  if (pctx == (lysp_ctx *)0x0) {
                                    plVar13 = (ly_ctx *)0x0;
                                  }
                                  else {
                                    plVar13 = (ly_ctx *)
                                              **(undefined8 **)
                                                (pctx->parsed_mods->field_2).dnodes
                                                [pctx->parsed_mods->count - 1];
                                  }
                                  sVar8 = strlen(pcVar9);
                                  ly_vlog(plVar13,(char *)0x0,LYVE_SYNTAX_YANG,
                                          "Invalid value \"%.*s\" of \"%s\".",sVar8 & 0xffffffff,
                                          pcVar9,"yang-version");
                                  return LY_EVALID;
                                }
                                cVar2 = '\x02';
                              }
                              *pcVar19 = cVar2;
                              pplVar14 = &stmt->child;
                              while( true ) {
                                plVar16 = *pplVar14;
                                if (plVar16 == (lysp_stmt *)0x0) {
                                  return LY_SUCCESS;
                                }
                                if (plVar16->kw != LY_STMT_EXTENSION_INSTANCE) break;
                                LVar3 = lysp_stmt_ext(pctx,plVar16,stmt->kw,0,
                                                      (lysp_ext_instance **)0x0);
                                pplVar14 = &plVar16->next;
                                if (LVar3 != LY_SUCCESS) {
                                  return LVar3;
                                }
                              }
                              if (pctx == (lysp_ctx *)0x0) {
                                plVar13 = (ly_ctx *)0x0;
                              }
                              else {
                                plVar13 = (ly_ctx *)
                                          **(undefined8 **)
                                            (pctx->parsed_mods->field_2).dnodes
                                            [pctx->parsed_mods->count - 1];
                              }
                              pcVar19 = lyplg_ext_stmt2str(plVar16->kw);
                              lVar17 = LY_STMT_YANG_VERSION;
LAB_00163b0f:
                              pcVar9 = lyplg_ext_stmt2str(lVar17);
                              ly_vlog(plVar13,(char *)0x0,LYVE_SYNTAX_YANG,
                                      "Invalid keyword \"%s\" as a child of \"%s\".",pcVar19,pcVar9)
                              ;
                              return LY_EVALID;
                            }
                            if (lVar17 == LY_STMT_YIN_ELEMENT) {
                              LVar3 = lysp_stmt_yinelem(pctx,stmt,(uint16_t *)*result,
                                                        (lysp_ext_instance **)0x0);
                              return LVar3;
                            }
                            goto switchD_00162242_caseD_2;
                          }
                          goto LAB_001622d2;
                        }
                        goto LAB_00162212;
                      }
                      type = (lysp_type *)calloc(1,0x68);
                      *result = type;
                      if (type != (lysp_type *)0x0) {
                        LVar3 = lysp_stmt_type(pctx,stmt,type);
                        return LVar3;
                      }
                    }
LAB_00162696:
                    if (pctx == (lysp_ctx *)0x0) {
                      plVar13 = (ly_ctx *)0x0;
                    }
                    else {
                      plVar13 = (ly_ctx *)
                                **(undefined8 **)
                                  (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
                    }
                    pcVar19 = "lysp_stmt_parse";
LAB_001626c4:
                    ly_log(plVar13,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",pcVar19);
                    return LY_EMEM;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00162212:
  ppcVar11 = (char **)0x2;
LAB_0016221e:
  LVar3 = lysp_stmt_text_field(pctx,stmt,(uint32_t)result,ppcVar11,Y_IDENTIF_ARG,in_R9);
  return LVar3;
}

Assistant:

static LY_ERR
lysp_stmt_parse(struct lysp_ctx *pctx, const struct lysp_stmt *stmt, void **result, struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    uint16_t flags;

    switch (stmt->kw) {
    case LY_STMT_NOTIFICATION:
        ret = lysp_stmt_notif(pctx, stmt, NULL, (struct lysp_node_notif **)result);
        break;
    case LY_STMT_INPUT:
    case LY_STMT_OUTPUT: {
        struct lysp_node_action_inout *inout;

        *result = inout = calloc(1, sizeof *inout);
        LY_CHECK_ERR_RET(!inout, LOGMEM(PARSER_CTX(pctx)), LY_EMEM);
        ret = lysp_stmt_inout(pctx, stmt, NULL, inout);
        break;
    }
    case LY_STMT_ACTION:
    case LY_STMT_RPC:
        ret = lysp_stmt_action(pctx, stmt, NULL, (struct lysp_node_action **)result);
        break;
    case LY_STMT_ANYDATA:
    case LY_STMT_ANYXML:
        ret = lysp_stmt_any(pctx, stmt, NULL, (struct lysp_node **)result);
        break;
    case LY_STMT_AUGMENT:
        ret = lysp_stmt_augment(pctx, stmt, NULL, (struct lysp_node_augment **)result);
        break;
    case LY_STMT_CASE:
        ret = lysp_stmt_case(pctx, stmt, NULL, (struct lysp_node **)result);
        break;
    case LY_STMT_CHOICE:
        ret = lysp_stmt_choice(pctx, stmt, NULL, (struct lysp_node **)result);
        break;
    case LY_STMT_CONTAINER:
        ret = lysp_stmt_container(pctx, stmt, NULL, (struct lysp_node **)result);
        break;
    case LY_STMT_GROUPING:
        ret = lysp_stmt_grouping(pctx, stmt, NULL, (struct lysp_node_grp **)result);
        break;
    case LY_STMT_LEAF:
        ret = lysp_stmt_leaf(pctx, stmt, NULL, (struct lysp_node **)result);
        break;
    case LY_STMT_LEAF_LIST:
        ret = lysp_stmt_leaflist(pctx, stmt, NULL, (struct lysp_node **)result);
        break;
    case LY_STMT_LIST:
        ret = lysp_stmt_list(pctx, stmt, NULL, (struct lysp_node **)result);
        break;
    case LY_STMT_USES:
        ret = lysp_stmt_uses(pctx, stmt, NULL, (struct lysp_node **)result);
        break;
    case LY_STMT_BASE:
        ret = lysp_stmt_text_fields(pctx, stmt, (const char ***)result, Y_PREF_IDENTIF_ARG, exts);
        break;
    case LY_STMT_ARGUMENT:
    case LY_STMT_BELONGS_TO:
    case LY_STMT_CONTACT:
    case LY_STMT_DESCRIPTION:
    case LY_STMT_ERROR_APP_TAG:
    case LY_STMT_ERROR_MESSAGE:
    case LY_STMT_KEY:
    case LY_STMT_NAMESPACE:
    case LY_STMT_ORGANIZATION:
    case LY_STMT_PRESENCE:
    case LY_STMT_REFERENCE:
    case LY_STMT_REVISION_DATE:
    case LY_STMT_UNITS:
        ret = lysp_stmt_text_field(pctx, stmt, 0, (const char **)result, Y_STR_ARG, exts);
        break;
    case LY_STMT_BIT:
    case LY_STMT_ENUM:
        ret = lysp_stmt_type_enum(pctx, stmt, (struct lysp_type_enum **)result);
        break;
    case LY_STMT_CONFIG:
        assert(*result);
        ret = lysp_stmt_config(pctx, stmt, *(uint16_t **)result, exts);
        break;
    case LY_STMT_DEFAULT:
    case LY_STMT_IF_FEATURE:
    case LY_STMT_UNIQUE:
        ret = lysp_stmt_qnames(pctx, stmt, (struct lysp_qname **)result, Y_STR_ARG, exts);
        break;
    case LY_STMT_DEVIATE:
        ret = lysp_stmt_deviate(pctx, stmt, (struct lysp_deviate **)result, exts);
        break;
    case LY_STMT_DEVIATION:
        ret = lysp_stmt_deviation(pctx, stmt, (struct lysp_deviation **)result);
        break;
    case LY_STMT_EXTENSION:
        ret = lysp_stmt_extension(pctx, stmt, (struct lysp_ext **)result);
        break;
    case LY_STMT_EXTENSION_INSTANCE:
        ret = lysp_stmt_ext(pctx, stmt, LY_STMT_EXTENSION_INSTANCE, 0, (struct lysp_ext_instance **)result);
        break;
    case LY_STMT_FEATURE:
        ret = lysp_stmt_feature(pctx, stmt, (struct lysp_feature **)result);
        break;
    case LY_STMT_FRACTION_DIGITS:
        ret = lysp_stmt_type_fracdigits(pctx, stmt, *(uint8_t **)result, exts);
        break;
    case LY_STMT_LENGTH:
    case LY_STMT_RANGE: {
        struct lysp_restr *restr;

        *result = restr = calloc(1, sizeof *restr);
        LY_CHECK_ERR_RET(!restr, LOGMEM(PARSER_CTX(pctx)), LY_EMEM);

        ret = lysp_stmt_restr(pctx, stmt, restr);
        break;
    }
    case LY_STMT_MUST:
        ret = lysp_stmt_restrs(pctx, stmt, (struct lysp_restr **)result);
        break;
    case LY_STMT_IDENTITY:
        ret = lysp_stmt_identity(pctx, stmt, (struct lysp_ident **)result);
        break;
    case LY_STMT_IMPORT:
        ret = lysp_stmt_import(pctx, stmt, (struct lysp_import **)result);
        break;
    case LY_STMT_INCLUDE:
        ret = lysp_stmt_include(pctx, stmt, (struct lysp_include **)result);
        break;
    case LY_STMT_MANDATORY:
        ret = lysp_stmt_mandatory(pctx, stmt, *(uint16_t **)result, exts);
        break;
    case LY_STMT_MAX_ELEMENTS:
        flags = 0;
        ret = lysp_stmt_maxelements(pctx, stmt, *(uint32_t **)result, &flags, exts);
        break;
    case LY_STMT_MIN_ELEMENTS:
        flags = 0;
        ret = lysp_stmt_minelements(pctx, stmt, *(uint32_t **)result, &flags, exts);
        break;
    case LY_STMT_MODIFIER:
        ret = lysp_stmt_type_pattern_modifier(pctx, stmt, (const char **)result, exts);
        break;
    case LY_STMT_MODULE: {
        struct lysp_module *mod;

        *result = mod = calloc(1, sizeof *mod);
        LY_CHECK_ERR_RET(!mod, LOGMEM(PARSER_CTX(pctx)), LY_EMEM);
        ret = lysp_stmt_module(pctx, stmt, mod);
        break;
    }
    case LY_STMT_ORDERED_BY:
        ret = lysp_stmt_orderedby(pctx, stmt, *(uint16_t **)result, exts);
        break;
    case LY_STMT_PATH: {
        const char *str_path = NULL;

        LY_CHECK_RET(lysp_stmt_text_field(pctx, stmt, 0, &str_path, Y_STR_ARG, exts));
        ret = ly_path_parse(PARSER_CTX(pctx), NULL, str_path, 0, 1, LY_PATH_BEGIN_EITHER,
                LY_PATH_PREFIX_OPTIONAL, LY_PATH_PRED_LEAFREF, (struct lyxp_expr **)result);
        lydict_remove(PARSER_CTX(pctx), str_path);
        break;
    }
    case LY_STMT_PATTERN:
        ret = lysp_stmt_type_pattern(pctx, stmt, (struct lysp_restr **)result);
        break;
    case LY_STMT_POSITION:
    case LY_STMT_VALUE:
        flags = 0;
        ret = lysp_stmt_type_enum_value_pos(pctx, stmt, *(int64_t **)result, &flags, exts);
        break;
    case LY_STMT_PREFIX:
        ret = lysp_stmt_text_field(pctx, stmt, 0, (const char **)result, Y_IDENTIF_ARG, exts);
        break;
    case LY_STMT_REFINE:
        ret = lysp_stmt_refine(pctx, stmt, (struct lysp_refine **)result);
        break;
    case LY_STMT_REQUIRE_INSTANCE:
        flags = 0;
        ret = lysp_stmt_type_reqinstance(pctx, stmt, *(uint8_t **)result, &flags, exts);
        break;
    case LY_STMT_REVISION:
        ret = lysp_stmt_revision(pctx, stmt, (struct lysp_revision **)result);
        break;
    case LY_STMT_STATUS:
        ret = lysp_stmt_status(pctx, stmt, (uint16_t *)result, exts);
        break;
    case LY_STMT_SUBMODULE: {
        struct lysp_submodule *submod;

        *result = submod = calloc(1, sizeof *submod);
        LY_CHECK_ERR_RET(!submod, LOGMEM(PARSER_CTX(pctx)), LY_EMEM);
        ret = lysp_stmt_submodule(pctx, stmt, submod);
        break;
    }
    case LY_STMT_TYPE: {
        struct lysp_type *type;

        *result = type = calloc(1, sizeof *type);
        LY_CHECK_ERR_RET(!type, LOGMEM(PARSER_CTX(pctx)), LY_EMEM);
        ret = lysp_stmt_type(pctx, stmt, type);
        break;
    }
    case LY_STMT_TYPEDEF:
        ret = lysp_stmt_typedef(pctx, stmt, NULL, (struct lysp_tpdf **)result);
        break;
    case LY_STMT_WHEN:
        ret = lysp_stmt_when(pctx, stmt, (struct lysp_when **)result);
        break;
    case LY_STMT_YANG_VERSION:
        ret = lysp_stmt_yangver(pctx, stmt, *(uint8_t **)result, exts);
        break;
    case LY_STMT_YIN_ELEMENT:
        ret = lysp_stmt_yinelem(pctx, stmt, *(uint16_t **)result, exts);
        break;
    default:
        LOGINT(PARSER_CTX(pctx));
        return LY_EINT;
    }

    return ret;
}